

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseType(JSONParser *this,Type *out_type)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  string type_str;
  
  type_str._M_dataplus._M_p = (pointer)&type_str.field_2;
  type_str._M_string_length = 0;
  type_str.field_2._M_local_buf[0] = '\0';
  RVar2 = ParseString(this,&type_str);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = std::operator==(&type_str,"i32");
    if (bVar1) {
      out_type->enum_ = I32;
      out_type->type_index_ = 0xffffffff;
    }
    else {
      bVar1 = std::operator==(&type_str,"f32");
      if (bVar1) {
        out_type->enum_ = F32;
        out_type->type_index_ = 0xffffffff;
      }
      else {
        bVar1 = std::operator==(&type_str,"i64");
        if (bVar1) {
          out_type->enum_ = I64;
          out_type->type_index_ = 0xffffffff;
        }
        else {
          bVar1 = std::operator==(&type_str,"f64");
          if (bVar1) {
            out_type->enum_ = F64;
            out_type->type_index_ = 0xffffffff;
          }
          else {
            bVar1 = std::operator==(&type_str,"v128");
            if (bVar1) {
              out_type->enum_ = V128;
              out_type->type_index_ = 0xffffffff;
            }
            else {
              bVar1 = std::operator==(&type_str,"i8");
              if (bVar1) {
                out_type->enum_ = I8;
                out_type->type_index_ = 0xffffffff;
              }
              else {
                bVar1 = std::operator==(&type_str,"i16");
                if (bVar1) {
                  out_type->enum_ = I16;
                  out_type->type_index_ = 0xffffffff;
                }
                else {
                  bVar1 = std::operator==(&type_str,"funcref");
                  if (bVar1) {
                    out_type->enum_ = FuncRef;
                    out_type->type_index_ = 0xffffffff;
                  }
                  else {
                    bVar1 = std::operator==(&type_str,"externref");
                    if (!bVar1) {
                      PrintError(this,"unknown type: \"%s\"",type_str._M_dataplus._M_p);
                      goto LAB_00118feb;
                    }
                    out_type->enum_ = ExternRef;
                    out_type->type_index_ = 0xffffffff;
                  }
                }
              }
            }
          }
        }
      }
    }
    EVar3 = Ok;
  }
LAB_00118feb:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseType(Type* out_type) {
  std::string type_str;
  CHECK_RESULT(ParseString(&type_str));

  if (type_str == "i32") {
    *out_type = Type::I32;
  } else if (type_str == "f32") {
    *out_type = Type::F32;
  } else if (type_str == "i64") {
    *out_type = Type::I64;
  } else if (type_str == "f64") {
    *out_type = Type::F64;
  } else if (type_str == "v128") {
    *out_type = Type::V128;
  } else if (type_str == "i8") {
    *out_type = Type::I8;
  } else if (type_str == "i16") {
    *out_type = Type::I16;
  } else if (type_str == "funcref") {
    *out_type = Type::FuncRef;
  } else if (type_str == "externref") {
    *out_type = Type::ExternRef;
  } else {
    PrintError("unknown type: \"%s\"", type_str.c_str());
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}